

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O0

t_gstub * gstub_new(_glist *gl,_array *a)

{
  t_gstub *ptVar1;
  t_gstub *gs;
  _array *a_local;
  _glist *gl_local;
  
  ptVar1 = (t_gstub *)getbytes(0x10);
  if (gl == (_glist *)0x0) {
    ptVar1->gs_which = 2;
    (ptVar1->gs_un).gs_array = a;
  }
  else {
    ptVar1->gs_which = 1;
    (ptVar1->gs_un).gs_glist = gl;
  }
  ptVar1->gs_refcount = 0;
  return ptVar1;
}

Assistant:

t_gstub *gstub_new(t_glist *gl, t_array *a)
{
    t_gstub *gs = t_getbytes(sizeof(*gs));
    if (gl)
    {
        gs->gs_which = GP_GLIST;
        gs->gs_un.gs_glist = gl;
    }
    else
    {
        gs->gs_which = GP_ARRAY;
        gs->gs_un.gs_array = a;
    }
    gs->gs_refcount = 0;
    return (gs);
}